

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O1

void __thiscall
Am_Inter_Location::Set_B_Control
          (Am_Inter_Location *this,Am_Location_Value_Control control,bool make_unique)

{
  int iVar1;
  undefined4 extraout_var;
  Am_Inter_Location_Data *this_00;
  
  if (this->data == (Am_Inter_Location_Data *)0x0) {
    this_00 = (Am_Inter_Location_Data *)operator_new(0x40);
    Am_Inter_Location_Data::Am_Inter_Location_Data(this_00);
  }
  else {
    if (!make_unique) goto LAB_001b4e2d;
    iVar1 = (*(this->data->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])()
    ;
    this_00 = (Am_Inter_Location_Data *)CONCAT44(extraout_var,iVar1);
  }
  this->data = this_00;
LAB_001b4e2d:
  this->data->b_control = control;
  return;
}

Assistant:

void
Am_Inter_Location::Set_B_Control(Am_Location_Value_Control control,
                                 bool make_unique)
{
  if (data) {
    if (make_unique)
      data = (Am_Inter_Location_Data *)data->Make_Unique();
  } else
    data = new Am_Inter_Location_Data();
  data->b_control = control;
}